

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

vector<Image,_std::allocator<Image>_> *
getContainerImages(vector<Image,_std::allocator<Image>_> *__return_storage_ptr__,string *rootDir)

{
  bool bVar1;
  path *ppVar2;
  reference pvVar3;
  value_type *__file;
  char *__s;
  Image local_2b0;
  uintmax_t local_268;
  uintmax_t fileSize;
  string local_258;
  undefined1 local_238 [8];
  string lastModified;
  stat attr;
  allocator<char> local_179;
  string local_178;
  path local_158;
  string_type local_130;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_110;
  string local_f8 [8];
  string imageId;
  directory_entry *archive;
  undefined1 local_c0 [8];
  recursive_directory_iterator __end1;
  undefined1 local_a0 [8];
  recursive_directory_iterator __begin1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  path local_60;
  recursive_directory_iterator local_38;
  recursive_directory_iterator *local_28;
  recursive_directory_iterator *__range1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_18;
  string *rootDir_local;
  vector<Image,_std::allocator<Image>_> *images;
  
  __range1._7_1_ = 0;
  local_18 = rootDir;
  rootDir_local = (string *)__return_storage_ptr__;
  std::vector<Image,_std::allocator<Image>_>::vector(__return_storage_ptr__);
  std::operator+(&local_80,local_18,"/images");
  std::filesystem::__cxx11::path::path(&local_60,&local_80,auto_format);
  std::filesystem::__cxx11::recursive_directory_iterator::recursive_directory_iterator
            (&local_38,&local_60);
  std::filesystem::__cxx11::path::~path(&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  local_28 = &local_38;
  std::filesystem::__cxx11::recursive_directory_iterator::recursive_directory_iterator
            ((recursive_directory_iterator *)&__end1._M_dirs._M_refcount,local_28);
  std::filesystem::__cxx11::begin
            ((__cxx11 *)local_a0,(recursive_directory_iterator *)&__end1._M_dirs._M_refcount);
  std::filesystem::__cxx11::recursive_directory_iterator::~recursive_directory_iterator
            ((recursive_directory_iterator *)&__end1._M_dirs._M_refcount);
  std::filesystem::__cxx11::recursive_directory_iterator::recursive_directory_iterator
            ((recursive_directory_iterator *)&archive,local_28);
  std::filesystem::__cxx11::end((recursive_directory_iterator *)local_c0);
  std::filesystem::__cxx11::recursive_directory_iterator::~recursive_directory_iterator
            ((recursive_directory_iterator *)&archive);
  while (bVar1 = std::filesystem::__cxx11::operator!=
                           ((recursive_directory_iterator *)local_a0,
                            (recursive_directory_iterator *)local_c0), bVar1) {
    imageId.field_2._8_8_ =
         std::filesystem::__cxx11::recursive_directory_iterator::operator*
                   ((recursive_directory_iterator *)local_a0);
    ppVar2 = std::filesystem::__cxx11::directory_entry::path
                       ((directory_entry *)imageId.field_2._8_8_);
    std::filesystem::__cxx11::path::filename(&local_158,ppVar2);
    std::filesystem::__cxx11::path::operator_cast_to_string(&local_130,&local_158);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_178,".",&local_179);
    split(&local_110,&local_130,&local_178);
    pvVar3 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](&local_110,0);
    std::__cxx11::string::string(local_f8,(string *)pvVar3);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_110);
    std::__cxx11::string::~string((string *)&local_178);
    std::allocator<char>::~allocator(&local_179);
    std::__cxx11::string::~string((string *)&local_130);
    std::filesystem::__cxx11::path::~path(&local_158);
    attr.__glibc_reserved[0] = 0;
    attr.__glibc_reserved[1] = 0;
    attr.st_ctim.tv_sec = 0;
    attr.st_ctim.tv_nsec = 0;
    attr.st_mtim.tv_sec = 0;
    attr.st_mtim.tv_nsec = 0;
    attr.st_atim.tv_sec = 0;
    attr.st_atim.tv_nsec = 0;
    attr.st_blksize = 0;
    attr.st_blocks = 0;
    attr.st_rdev = 0;
    attr.st_size = 0;
    attr.st_mode = 0;
    attr.st_uid = 0;
    attr.st_gid = 0;
    attr.__pad0 = 0;
    attr.st_ino = 0;
    attr.st_nlink = 0;
    lastModified.field_2._8_8_ = 0;
    attr.st_dev = 0;
    ppVar2 = std::filesystem::__cxx11::directory_entry::path
                       ((directory_entry *)imageId.field_2._8_8_);
    __file = std::filesystem::__cxx11::path::c_str(ppVar2);
    stat(__file,(stat *)((long)&lastModified.field_2 + 8));
    __s = ctime(&attr.st_atim.tv_nsec);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_258,__s,(allocator<char> *)((long)&fileSize + 7));
    trimEnd((string *)local_238,&local_258);
    std::__cxx11::string::~string((string *)&local_258);
    std::allocator<char>::~allocator((allocator<char> *)((long)&fileSize + 7));
    ppVar2 = std::filesystem::__cxx11::directory_entry::operator_cast_to_path_
                       ((directory_entry *)imageId.field_2._8_8_);
    local_268 = std::filesystem::file_size(ppVar2);
    std::__cxx11::string::string((string *)&local_2b0,local_f8);
    local_2b0.fileSize = local_268;
    std::__cxx11::string::string((string *)&local_2b0.lastModified,(string *)local_238);
    std::vector<Image,_std::allocator<Image>_>::emplace_back<Image>
              (__return_storage_ptr__,&local_2b0);
    Image::~Image(&local_2b0);
    std::__cxx11::string::~string((string *)local_238);
    std::__cxx11::string::~string(local_f8);
    std::filesystem::__cxx11::recursive_directory_iterator::operator++
              ((recursive_directory_iterator *)local_a0);
  }
  std::filesystem::__cxx11::recursive_directory_iterator::~recursive_directory_iterator
            ((recursive_directory_iterator *)local_c0);
  std::filesystem::__cxx11::recursive_directory_iterator::~recursive_directory_iterator
            ((recursive_directory_iterator *)local_a0);
  std::filesystem::__cxx11::recursive_directory_iterator::~recursive_directory_iterator(&local_38);
  return __return_storage_ptr__;
}

Assistant:

std::vector<Image> getContainerImages(const std::string& rootDir)
{
    std::vector<Image> images;
    for (const auto& archive : std::filesystem::recursive_directory_iterator(rootDir + "/images"))
    {
        std::string imageId = split(archive.path().filename(), ".")[0];
        // Obtains the time at which the file was last modified
        struct stat attr{};
        stat(archive.path().c_str(), &attr);
        std::string lastModified(trimEnd(ctime(&attr.st_mtime)));

        uintmax_t fileSize = std::filesystem::file_size(archive);
        images.emplace_back(Image { imageId, fileSize, lastModified });
    }
    return images;
}